

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

Fad<float> * __thiscall
TPZFMatrix<Fad<float>_>::GetVal(TPZFMatrix<Fad<float>_> *this,int64_t row,int64_t col)

{
  Fad<float> *in_RDX;
  Fad<float> *in_RSI;
  Fad<float> *in_RDI;
  
  Fad<float>::Fad(in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

inline const TVar TPZFMatrix<TVar>::GetVal( const int64_t row, const int64_t col ) const {
    return( fElem[ col*this->fRow + row ] );
}